

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O1

int check_bb_context(dmr_C *C,entrypoint *ep,basic_block *bb,int entry,int exit)

{
  int iVar1;
  char *pcVar2;
  basic_block *bb_00;
  int iVar3;
  entrypoint *ep_00;
  ulong uVar4;
  char *in_R9;
  undefined1 local_58 [8];
  ptr_list_iter insniter__;
  
  uVar4 = (ulong)(uint)exit;
  if (bb == (basic_block *)0x0) {
    return 0;
  }
  if (bb->context == entry) {
    return 0;
  }
  if (bb->context < 0) {
    bb->context = entry;
    insniter__._16_8_ = ep;
    ptrlist_forward_iterator(local_58,bb->insns);
    pcVar2 = (char *)ptrlist_iter_next(local_58);
    iVar3 = 0;
    while (iVar1 = (int)uVar4, pcVar2 != (char *)0x0) {
      if (*pcVar2 == '>') {
        iVar1 = *(int *)(pcVar2 + 0x28);
        if (*(int *)(pcVar2 + 0x2c) == 0) {
          iVar3 = iVar1 + iVar3;
        }
        else if (iVar1 == 0) {
          if (entry + iVar3 != 0) goto LAB_001016da;
        }
        else if (entry + iVar3 < iVar1) {
LAB_001016da:
          dmrC_warning(C,*(undefined8 *)(pcVar2 + 0x10),"context check failure");
        }
      }
      pcVar2 = (char *)ptrlist_iter_next(local_58);
    }
    iVar3 = iVar3 + entry;
    if (iVar3 < 0) {
      iVar3 = 0x1020c9;
      ep_00 = (entrypoint *)insniter__._16_8_;
    }
    else {
      pcVar2 = (char *)ptrlist_last(bb->insns);
      if (pcVar2 == (char *)0x0) {
        return 0;
      }
      if (*pcVar2 != '\x02') {
        ptrlist_forward_iterator(local_58,bb->children);
        do {
          bb_00 = (basic_block *)ptrlist_iter_next(local_58);
          if (bb_00 == (basic_block *)0x0) break;
          iVar1 = check_bb_context(C,(entrypoint *)insniter__._16_8_,bb_00,iVar3,exit);
        } while (iVar1 == 0);
        return -(uint)(bb_00 != (basic_block *)0x0);
      }
      if (iVar3 == exit) {
        return 0;
      }
      iVar3 = 0x102110;
      ep_00 = (entrypoint *)insniter__._16_8_;
    }
  }
  else {
    iVar3 = 0x1020a1;
    ep_00 = ep;
    iVar1 = exit;
  }
  imbalance(C,ep_00,bb,iVar3,iVar1,in_R9);
  return -1;
}

Assistant:

static int check_bb_context(struct dmr_C *C, struct entrypoint *ep, struct basic_block *bb, int entry, int exit)
{
	if (!bb)
		return 0;
	if (bb->context == entry)
		return 0;

	/* Now that's not good.. */
	if (bb->context >= 0)
		return imbalance(C, ep, bb, entry, bb->context, "different lock contexts for basic block");

	bb->context = entry;
	entry += context_increase(C, bb, entry);
	if (entry < 0)
		return imbalance(C, ep, bb, entry, exit, "unexpected unlock");

	return check_children(C, ep, bb, entry, exit);
}